

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O3

void borg_free_flow_kill(void)

{
  long lVar1;
  
  mem_free(borg_normal_what);
  borg_normal_what = (uint *)0x0;
  if (borg_normal_text != (char **)0x0) {
    if (L'\0' < borg_normal_size) {
      lVar1 = 0;
      do {
        string_free(borg_normal_text[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < borg_normal_size);
    }
    mem_free(borg_normal_text);
    borg_normal_text = (char **)0x0;
  }
  borg_normal_size = L'\0';
  mem_free(borg_unique_what);
  borg_unique_what = (uint *)0x0;
  if (borg_unique_text != (char **)0x0) {
    if (L'\0' < borg_unique_size) {
      lVar1 = 0;
      do {
        string_free(borg_unique_text[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < borg_unique_size);
    }
    mem_free(borg_unique_text);
    borg_unique_text = (char **)0x0;
  }
  borg_unique_size = L'\0';
  mem_free(borg_race_death);
  borg_race_death = (int16_t *)0x0;
  mem_free(borg_race_count);
  borg_race_count = (int16_t *)0x0;
  mem_free(borg_kills);
  borg_kills = (borg_kill *)0x0;
  return;
}

Assistant:

static void borg_free_monster_names(void)
{
    int i;

    mem_free(borg_normal_what);
    borg_normal_what = NULL;
    if (borg_normal_text) {
        for (i = 0; i < borg_normal_size; ++i) {
            string_free((char *)borg_normal_text[i]);
        }
        mem_free(borg_normal_text);
        borg_normal_text = NULL;
    }
    borg_normal_size = 0;
    mem_free(borg_unique_what);
    borg_unique_what = NULL;
    if (borg_unique_text) {
        for (i = 0; i < borg_unique_size; ++i) {
            string_free((char *)borg_unique_text[i]);
        }
        mem_free(borg_unique_text);
        borg_unique_text = NULL;
    }
    borg_unique_size = 0;
}